

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<8,_1,_false,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  RTCRayQueryContext *pRVar3;
  bool bVar4;
  undefined1 auVar5 [32];
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  byte bVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong unaff_R12;
  size_t mask;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [64];
  undefined4 uVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  uint uVar56;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  uint local_260c;
  int local_25f4;
  RTCIntersectArguments *local_25f0;
  ulong local_25e8;
  Geometry *local_25e0;
  ulong local_25d8;
  ulong local_25d0;
  ulong local_25c8;
  ulong local_25c0;
  ulong local_25b8;
  ulong *local_25b0;
  Scene *local_25a8;
  ulong local_25a0;
  RTCFilterFunctionNArguments local_2598;
  float local_2568;
  undefined4 local_2564;
  undefined4 local_2560;
  float local_255c;
  float local_2558;
  undefined4 local_2554;
  uint local_2550;
  uint local_254c;
  uint local_2548;
  undefined1 local_2538 [16];
  undefined1 local_2528 [16];
  undefined1 local_2518 [16];
  undefined1 local_2508 [16];
  byte local_24f7;
  float local_24e8 [4];
  float local_24d8 [4];
  undefined1 local_24c8 [16];
  undefined1 local_24b8 [16];
  undefined1 local_24a8 [16];
  undefined1 local_2498 [16];
  undefined1 local_2488 [16];
  undefined1 local_2478 [32];
  undefined1 local_2458 [32];
  undefined1 local_2438 [32];
  undefined1 local_2418 [32];
  undefined1 local_23f8 [32];
  undefined1 local_23d8 [32];
  undefined1 local_23b8 [32];
  undefined1 local_2398 [32];
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
    local_2370[0] = 0;
    if (local_2378 != 8) {
      aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
      auVar26 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar34 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar23._8_4_ = 0x7fffffff;
      auVar23._0_8_ = 0x7fffffff7fffffff;
      auVar23._12_4_ = 0x7fffffff;
      auVar23 = vandps_avx512vl((undefined1  [16])aVar2,auVar23);
      auVar52._8_4_ = 0x219392ef;
      auVar52._0_8_ = 0x219392ef219392ef;
      auVar52._12_4_ = 0x219392ef;
      uVar20 = vcmpps_avx512vl(auVar23,auVar52,1);
      bVar4 = (bool)((byte)uVar20 & 1);
      auVar24._0_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * (int)aVar2.x;
      bVar4 = (bool)((byte)(uVar20 >> 1) & 1);
      auVar24._4_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * (int)aVar2.y;
      bVar4 = (bool)((byte)(uVar20 >> 2) & 1);
      auVar24._8_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * (int)aVar2.z;
      bVar4 = (bool)((byte)(uVar20 >> 3) & 1);
      auVar24._12_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * aVar2.field_3.a;
      auVar23 = vrcp14ps_avx512vl(auVar24);
      auVar25._8_4_ = 0x3f800000;
      auVar25._0_8_ = &DAT_3f8000003f800000;
      auVar25._12_4_ = 0x3f800000;
      auVar25 = vfnmadd213ps_avx512vl(auVar24,auVar23,auVar25);
      local_25b0 = local_2368;
      auVar24 = vfmadd132ps_fma(auVar25,auVar23,auVar23);
      auVar37 = vbroadcastss_avx512vl(auVar24);
      auVar63 = ZEXT3264(auVar37);
      auVar23 = vmovshdup_avx(auVar24);
      auVar37 = vbroadcastsd_avx512vl(auVar23);
      auVar64 = ZEXT3264(auVar37);
      auVar25 = vshufpd_avx(auVar24,auVar24,1);
      auVar54._8_4_ = 2;
      auVar54._0_8_ = 0x200000002;
      auVar54._12_4_ = 2;
      auVar54._16_4_ = 2;
      auVar54._20_4_ = 2;
      auVar54._24_4_ = 2;
      auVar54._28_4_ = 2;
      auVar37 = vpermps_avx512vl(auVar54,ZEXT1632(auVar24));
      auVar65 = ZEXT3264(auVar37);
      fVar44 = auVar24._0_4_ * (ray->super_RayK<1>).org.field_0.m128[0];
      auVar42._4_4_ = fVar44;
      auVar42._0_4_ = fVar44;
      auVar42._8_4_ = fVar44;
      auVar42._12_4_ = fVar44;
      auVar42._16_4_ = fVar44;
      auVar42._20_4_ = fVar44;
      auVar42._24_4_ = fVar44;
      auVar42._28_4_ = fVar44;
      auVar37 = vbroadcastss_avx512vl(ZEXT416(1));
      auVar66 = ZEXT3264(auVar37);
      auVar39 = ZEXT1632(CONCAT412(auVar24._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                   CONCAT48(auVar24._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2]
                                            ,CONCAT44(auVar24._4_4_ *
                                                      (ray->super_RayK<1>).org.field_0.m128[1],
                                                      fVar44))));
      auVar38 = vpermps_avx512vl(auVar37,auVar39);
      auVar55 = ZEXT3264(auVar38);
      auVar37 = vpermps_avx2(auVar54,auVar39);
      local_25b8 = (ulong)(auVar24._0_4_ < 0.0) << 5;
      local_25c0 = (ulong)(auVar23._0_4_ < 0.0) << 5 | 0x40;
      local_25c8 = (ulong)(auVar25._0_4_ < 0.0) << 5 | 0x80;
      local_25d0 = local_25b8 ^ 0x20;
      local_25d8 = local_25c0 ^ 0x20;
      uVar48 = auVar34._0_4_;
      auVar47 = ZEXT3264(CONCAT428(uVar48,CONCAT424(uVar48,CONCAT420(uVar48,CONCAT416(uVar48,
                                                  CONCAT412(uVar48,CONCAT48(uVar48,CONCAT44(uVar48,
                                                  uVar48))))))));
      auVar40._8_4_ = 0x80000000;
      auVar40._0_8_ = 0x8000000080000000;
      auVar40._12_4_ = 0x80000000;
      auVar40._16_4_ = 0x80000000;
      auVar40._20_4_ = 0x80000000;
      auVar40._24_4_ = 0x80000000;
      auVar40._28_4_ = 0x80000000;
      auVar39 = vxorps_avx512vl(auVar42,auVar40);
      auVar67 = ZEXT3264(auVar39);
      auVar38 = vxorps_avx512vl(auVar38,auVar40);
      auVar68 = ZEXT3264(auVar38);
      auVar37 = vxorps_avx512vl(auVar37,auVar40);
      auVar69 = ZEXT3264(auVar37);
      auVar37 = vbroadcastss_avx512vl(auVar26);
      auVar70 = ZEXT3264(auVar37);
      auVar37 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
      auVar71 = ZEXT3264(auVar37);
      auVar37 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
      auVar72 = ZEXT3264(auVar37);
      auVar26 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
      auVar73 = ZEXT1664(auVar26);
      auVar37 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
      auVar74 = ZEXT3264(auVar37);
      auVar37 = vpmovsxbd_avx512vl(ZEXT816(0x5040302010008));
      auVar75 = ZEXT3264(auVar37);
      local_25a0 = local_25c8 ^ 0x20;
      uVar20 = local_25c8 ^ 0x20;
      do {
        do {
          do {
            if (local_25b0 == &local_2378) {
              return;
            }
            pfVar1 = (float *)(local_25b0 + -1);
            local_25b0 = local_25b0 + -2;
          } while ((ray->super_RayK<1>).tfar < *pfVar1);
          uVar22 = *local_25b0;
          do {
            if ((uVar22 & 8) == 0) {
              auVar37 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar22 + 0x40 + local_25b8),auVar67._0_32_
                                   ,auVar63._0_32_);
              auVar38 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar22 + 0x40 + local_25c0),auVar68._0_32_
                                   ,auVar64._0_32_);
              auVar37 = vpmaxsd_avx2(auVar37,auVar38);
              auVar38 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar22 + 0x40 + local_25c8),auVar69._0_32_
                                   ,auVar65._0_32_);
              auVar38 = vpmaxsd_avx512vl(auVar38,auVar70._0_32_);
              auVar37 = vpmaxsd_avx2(auVar37,auVar38);
              auVar55 = ZEXT3264(auVar37);
              auVar38 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar22 + 0x40 + local_25d0),auVar67._0_32_
                                   ,auVar63._0_32_);
              auVar39 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar22 + 0x40 + local_25d8),auVar68._0_32_
                                   ,auVar64._0_32_);
              auVar38 = vpminsd_avx2(auVar38,auVar39);
              auVar39 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar22 + 0x40 + uVar20),auVar69._0_32_,
                                   auVar65._0_32_);
              auVar39 = vpminsd_avx2(auVar39,auVar47._0_32_);
              auVar38 = vpminsd_avx2(auVar38,auVar39);
              uVar9 = vpcmpd_avx512vl(auVar37,auVar38,2);
              unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),(uint)(byte)uVar9);
            }
            if ((uVar22 & 8) == 0) {
              if (unaff_R12 == 0) {
                iVar16 = 4;
              }
              else {
                auVar37 = *(undefined1 (*) [32])(uVar22 & 0xfffffffffffffff0);
                auVar38 = ((undefined1 (*) [32])(uVar22 & 0xfffffffffffffff0))[1];
                auVar39 = vmovdqa64_avx512vl(auVar71._0_32_);
                auVar54 = auVar55._0_32_;
                auVar39 = vpternlogd_avx512vl(auVar39,auVar54,auVar72._0_32_,0xf8);
                uVar22 = unaff_R12 & 0xffffffff;
                auVar40 = vpcompressd_avx512vl(auVar39);
                bVar4 = (bool)((byte)uVar22 & 1);
                auVar41._0_4_ = (uint)bVar4 * auVar40._0_4_ | (uint)!bVar4 * auVar39._0_4_;
                bVar4 = (bool)((byte)(uVar22 >> 1) & 1);
                auVar41._4_4_ = (uint)bVar4 * auVar40._4_4_ | (uint)!bVar4 * auVar39._4_4_;
                bVar4 = (bool)((byte)(uVar22 >> 2) & 1);
                auVar41._8_4_ = (uint)bVar4 * auVar40._8_4_ | (uint)!bVar4 * auVar39._8_4_;
                bVar4 = (bool)((byte)(uVar22 >> 3) & 1);
                auVar41._12_4_ = (uint)bVar4 * auVar40._12_4_ | (uint)!bVar4 * auVar39._12_4_;
                bVar4 = (bool)((byte)(uVar22 >> 4) & 1);
                auVar41._16_4_ = (uint)bVar4 * auVar40._16_4_ | (uint)!bVar4 * auVar39._16_4_;
                bVar4 = (bool)((byte)(uVar22 >> 5) & 1);
                auVar41._20_4_ = (uint)bVar4 * auVar40._20_4_ | (uint)!bVar4 * auVar39._20_4_;
                bVar4 = (bool)((byte)(uVar22 >> 6) & 1);
                auVar41._24_4_ = (uint)bVar4 * auVar40._24_4_ | (uint)!bVar4 * auVar39._24_4_;
                bVar4 = (bool)((byte)(uVar22 >> 7) & 1);
                auVar41._28_4_ = (uint)bVar4 * auVar40._28_4_ | (uint)!bVar4 * auVar39._28_4_;
                auVar39 = vpermt2q_avx512vl(auVar37,auVar41,auVar38);
                uVar22 = auVar39._0_8_;
                iVar16 = 0;
                uVar18 = unaff_R12 - 1 & unaff_R12;
                if (uVar18 != 0) {
                  auVar39 = vpshufd_avx2(auVar41,0x55);
                  vpermt2q_avx512vl(auVar37,auVar39,auVar38);
                  auVar40 = vpminsd_avx2(auVar41,auVar39);
                  auVar39 = vpmaxsd_avx2(auVar41,auVar39);
                  uVar18 = uVar18 - 1 & uVar18;
                  if (uVar18 == 0) {
                    auVar40 = vpermi2q_avx512vl(auVar40,auVar37,auVar38);
                    uVar22 = auVar40._0_8_;
                    auVar37 = vpermt2q_avx512vl(auVar37,auVar39,auVar38);
                    *local_25b0 = auVar37._0_8_;
                    auVar37 = vpermd_avx2(auVar39,auVar54);
                    *(int *)(local_25b0 + 1) = auVar37._0_4_;
                    local_25b0 = local_25b0 + 2;
                  }
                  else {
                    auVar43 = vpshufd_avx2(auVar41,0xaa);
                    vpermt2q_avx512vl(auVar37,auVar43,auVar38);
                    auVar42 = vpminsd_avx2(auVar40,auVar43);
                    auVar40 = vpmaxsd_avx2(auVar40,auVar43);
                    auVar43 = vpminsd_avx2(auVar39,auVar40);
                    auVar39 = vpmaxsd_avx2(auVar39,auVar40);
                    uVar18 = uVar18 - 1 & uVar18;
                    if (uVar18 == 0) {
                      auVar40 = vpermi2q_avx512vl(auVar42,auVar37,auVar38);
                      uVar22 = auVar40._0_8_;
                      auVar40 = vpermt2q_avx512vl(auVar37,auVar39,auVar38);
                      *local_25b0 = auVar40._0_8_;
                      auVar39 = vpermd_avx2(auVar39,auVar54);
                      *(int *)(local_25b0 + 1) = auVar39._0_4_;
                      auVar37 = vpermt2q_avx512vl(auVar37,auVar43,auVar38);
                      local_25b0[2] = auVar37._0_8_;
                      auVar37 = vpermd_avx2(auVar43,auVar54);
                      *(int *)(local_25b0 + 3) = auVar37._0_4_;
                      local_25b0 = local_25b0 + 4;
                    }
                    else {
                      auVar40 = vpshufd_avx2(auVar41,0xff);
                      vpermt2q_avx512vl(auVar37,auVar40,auVar38);
                      auVar5 = vpminsd_avx2(auVar42,auVar40);
                      auVar40 = vpmaxsd_avx2(auVar42,auVar40);
                      auVar42 = vpminsd_avx2(auVar43,auVar40);
                      auVar40 = vpmaxsd_avx2(auVar43,auVar40);
                      auVar43 = vpminsd_avx2(auVar39,auVar40);
                      auVar39 = vpmaxsd_avx2(auVar39,auVar40);
                      uVar18 = uVar18 - 1 & uVar18;
                      if (uVar18 == 0) {
                        auVar40 = vpermi2q_avx512vl(auVar5,auVar37,auVar38);
                        uVar22 = auVar40._0_8_;
                        auVar40 = vpermt2q_avx512vl(auVar37,auVar39,auVar38);
                        *local_25b0 = auVar40._0_8_;
                        auVar55 = ZEXT3264(auVar54);
                        auVar39 = vpermd_avx2(auVar39,auVar54);
                        *(int *)(local_25b0 + 1) = auVar39._0_4_;
                        auVar39 = vpermt2q_avx512vl(auVar37,auVar43,auVar38);
                        local_25b0[2] = auVar39._0_8_;
                        auVar39 = vpermd_avx2(auVar43,auVar54);
                        *(int *)(local_25b0 + 3) = auVar39._0_4_;
                        auVar37 = vpermt2q_avx512vl(auVar37,auVar42,auVar38);
                        local_25b0[4] = auVar37._0_8_;
                        auVar37 = vpermd_avx2(auVar42,auVar54);
                        *(int *)(local_25b0 + 5) = auVar37._0_4_;
                        local_25b0 = local_25b0 + 6;
                      }
                      else {
                        auVar41 = valignd_avx512vl(auVar41,auVar41,3);
                        auVar40 = vmovdqa64_avx512vl(auVar73._0_32_);
                        auVar40 = vpermt2d_avx512vl(auVar40,auVar74._0_32_,auVar5);
                        auVar40 = vpermt2d_avx512vl(auVar40,auVar75._0_32_,auVar42);
                        auVar42 = vpermt2d_avx512vl(auVar40,auVar75._0_32_,auVar43);
                        auVar40 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                        auVar39 = vpermt2d_avx512vl(auVar42,auVar40,auVar39);
                        auVar55 = ZEXT3264(auVar39);
                        uVar22 = uVar18;
                        do {
                          auVar40 = auVar55._0_32_;
                          auVar39 = vpermps_avx512vl(auVar66._0_32_,auVar41);
                          auVar41 = valignd_avx512vl(auVar41,auVar41,1);
                          vpermt2q_avx512vl(auVar37,auVar41,auVar38);
                          uVar22 = uVar22 - 1 & uVar22;
                          uVar9 = vpcmpd_avx512vl(auVar39,auVar40,5);
                          auVar39 = vpmaxsd_avx2(auVar39,auVar40);
                          bVar15 = (byte)uVar9 << 1;
                          auVar40 = valignd_avx512vl(auVar40,auVar40,7);
                          bVar4 = (bool)((byte)uVar9 & 1);
                          auVar43._4_4_ = (uint)bVar4 * auVar40._4_4_ | (uint)!bVar4 * auVar39._4_4_
                          ;
                          auVar43._0_4_ = auVar39._0_4_;
                          bVar4 = (bool)(bVar15 >> 2 & 1);
                          auVar43._8_4_ = (uint)bVar4 * auVar40._8_4_ | (uint)!bVar4 * auVar39._8_4_
                          ;
                          bVar4 = (bool)(bVar15 >> 3 & 1);
                          auVar43._12_4_ =
                               (uint)bVar4 * auVar40._12_4_ | (uint)!bVar4 * auVar39._12_4_;
                          bVar4 = (bool)(bVar15 >> 4 & 1);
                          auVar43._16_4_ =
                               (uint)bVar4 * auVar40._16_4_ | (uint)!bVar4 * auVar39._16_4_;
                          bVar4 = (bool)(bVar15 >> 5 & 1);
                          auVar43._20_4_ =
                               (uint)bVar4 * auVar40._20_4_ | (uint)!bVar4 * auVar39._20_4_;
                          bVar4 = (bool)(bVar15 >> 6 & 1);
                          auVar43._24_4_ =
                               (uint)bVar4 * auVar40._24_4_ | (uint)!bVar4 * auVar39._24_4_;
                          auVar43._28_4_ =
                               (uint)(bVar15 >> 7) * auVar40._28_4_ |
                               (uint)!(bool)(bVar15 >> 7) * auVar39._28_4_;
                          auVar55 = ZEXT3264(auVar43);
                        } while (uVar22 != 0);
                        lVar19 = POPCOUNT(uVar18) + 3;
                        do {
                          auVar39 = vpermi2q_avx512vl(auVar43,auVar37,auVar38);
                          *local_25b0 = auVar39._0_8_;
                          auVar40 = auVar55._0_32_;
                          auVar39 = vpermd_avx2(auVar40,auVar54);
                          *(int *)(local_25b0 + 1) = auVar39._0_4_;
                          auVar43 = valignd_avx512vl(auVar40,auVar40,1);
                          local_25b0 = local_25b0 + 2;
                          auVar55 = ZEXT3264(auVar43);
                          lVar19 = lVar19 + -1;
                        } while (lVar19 != 0);
                        auVar37 = vpermt2q_avx512vl(auVar37,auVar43,auVar38);
                        uVar22 = auVar37._0_8_;
                        auVar55 = ZEXT3264(auVar54);
                        iVar16 = 0;
                      }
                    }
                  }
                }
              }
            }
            else {
              iVar16 = 6;
            }
          } while (iVar16 == 0);
        } while (iVar16 != 6);
        local_2398 = auVar55._0_32_;
        uVar20 = (ulong)((uint)uVar22 & 0xf);
        if (uVar20 != 8) {
          uVar22 = uVar22 & 0xfffffffffffffff0;
          lVar19 = 0;
          do {
            lVar21 = lVar19 * 0xb0;
            auVar26 = *(undefined1 (*) [16])(uVar22 + 0x80 + lVar21);
            auVar34 = *(undefined1 (*) [16])(uVar22 + 0x40 + lVar21);
            auVar23 = *(undefined1 (*) [16])(uVar22 + 0x70 + lVar21);
            auVar25 = *(undefined1 (*) [16])(uVar22 + 0x50 + lVar21);
            auVar27._0_4_ = auVar34._0_4_ * auVar26._0_4_;
            auVar27._4_4_ = auVar34._4_4_ * auVar26._4_4_;
            auVar27._8_4_ = auVar34._8_4_ * auVar26._8_4_;
            auVar27._12_4_ = auVar34._12_4_ * auVar26._12_4_;
            auVar24 = *(undefined1 (*) [16])(uVar22 + 0x60 + lVar21);
            auVar52 = *(undefined1 (*) [16])(uVar22 + 0x30 + lVar21);
            local_24b8 = vfmsub231ps_fma(auVar27,auVar23,auVar25);
            auVar31._0_4_ = auVar25._0_4_ * auVar24._0_4_;
            auVar31._4_4_ = auVar25._4_4_ * auVar24._4_4_;
            auVar31._8_4_ = auVar25._8_4_ * auVar24._8_4_;
            auVar31._12_4_ = auVar25._12_4_ * auVar24._12_4_;
            local_24a8 = vfmsub231ps_fma(auVar31,auVar26,auVar52);
            auVar32._0_4_ = auVar52._0_4_ * auVar23._0_4_;
            auVar32._4_4_ = auVar52._4_4_ * auVar23._4_4_;
            auVar32._8_4_ = auVar52._8_4_ * auVar23._8_4_;
            auVar32._12_4_ = auVar52._12_4_ * auVar23._12_4_;
            uVar48 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
            auVar60._4_4_ = uVar48;
            auVar60._0_4_ = uVar48;
            auVar60._8_4_ = uVar48;
            auVar60._12_4_ = uVar48;
            uVar48 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
            auVar61._4_4_ = uVar48;
            auVar61._0_4_ = uVar48;
            auVar61._8_4_ = uVar48;
            auVar61._12_4_ = uVar48;
            fVar44 = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar33._4_4_ = fVar44;
            auVar33._0_4_ = fVar44;
            auVar33._8_4_ = fVar44;
            auVar33._12_4_ = fVar44;
            uVar48 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar30._4_4_ = uVar48;
            auVar30._0_4_ = uVar48;
            auVar30._8_4_ = uVar48;
            auVar30._12_4_ = uVar48;
            auVar27 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar22 + lVar21),auVar30);
            local_2498 = vfmsub231ps_fma(auVar32,auVar24,auVar34);
            uVar48 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar28._4_4_ = uVar48;
            auVar28._0_4_ = uVar48;
            auVar28._8_4_ = uVar48;
            auVar28._12_4_ = uVar48;
            auVar28 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar22 + 0x10 + lVar21),auVar28);
            uVar48 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar29._4_4_ = uVar48;
            auVar29._0_4_ = uVar48;
            auVar29._8_4_ = uVar48;
            auVar29._12_4_ = uVar48;
            auVar29 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar22 + 0x20 + lVar21),auVar29);
            auVar30 = vmulps_avx512vl(auVar61,auVar29);
            auVar31 = vfmsub231ps_avx512vl(auVar30,auVar28,auVar33);
            auVar30 = vmulps_avx512vl(auVar33,auVar27);
            auVar32 = vfmsub231ps_avx512vl(auVar30,auVar29,auVar60);
            auVar30 = vmulps_avx512vl(auVar60,auVar28);
            auVar33 = vfmsub231ps_avx512vl(auVar30,auVar27,auVar61);
            auVar62._0_4_ = fVar44 * local_2498._0_4_;
            auVar62._4_4_ = fVar44 * local_2498._4_4_;
            auVar62._8_4_ = fVar44 * local_2498._8_4_;
            auVar62._12_4_ = fVar44 * local_2498._12_4_;
            auVar30 = vfmadd231ps_fma(auVar62,local_24a8,auVar61);
            auVar30 = vfmadd231ps_fma(auVar30,local_24b8,auVar60);
            auVar10._8_4_ = 0x7fffffff;
            auVar10._0_8_ = 0x7fffffff7fffffff;
            auVar10._12_4_ = 0x7fffffff;
            local_2508 = vandps_avx512vl(auVar30,auVar10);
            auVar26 = vmulps_avx512vl(auVar26,auVar33);
            auVar26 = vfmadd231ps_avx512vl(auVar26,auVar32,auVar23);
            auVar23 = vfmadd231ps_avx512vl(auVar26,auVar31,auVar24);
            auVar26._8_4_ = 0x80000000;
            auVar26._0_8_ = 0x8000000080000000;
            auVar26._12_4_ = 0x80000000;
            auVar26 = vandpd_avx512vl(auVar30,auVar26);
            uVar56 = auVar26._0_4_;
            local_2538._0_4_ = (float)(uVar56 ^ auVar23._0_4_);
            uVar57 = auVar26._4_4_;
            local_2538._4_4_ = (float)(uVar57 ^ auVar23._4_4_);
            uVar58 = auVar26._8_4_;
            local_2538._8_4_ = (float)(uVar58 ^ auVar23._8_4_);
            uVar59 = auVar26._12_4_;
            local_2538._12_4_ = (float)(uVar59 ^ auVar23._12_4_);
            auVar26 = vmulps_avx512vl(auVar25,auVar33);
            auVar26 = vfmadd231ps_avx512vl(auVar26,auVar34,auVar32);
            auVar26 = vfmadd231ps_avx512vl(auVar26,auVar52,auVar31);
            local_2528._0_4_ = (float)(uVar56 ^ auVar26._0_4_);
            local_2528._4_4_ = (float)(uVar57 ^ auVar26._4_4_);
            local_2528._8_4_ = (float)(uVar58 ^ auVar26._8_4_);
            local_2528._12_4_ = (float)(uVar59 ^ auVar26._12_4_);
            auVar26 = ZEXT816(0) << 0x20;
            uVar9 = vcmpps_avx512vl(local_2538,auVar26,5);
            uVar6 = vcmpps_avx512vl(local_2528,auVar26,5);
            uVar7 = vcmpps_avx512vl(auVar30,auVar26,4);
            auVar34._0_4_ = local_2528._0_4_ + local_2538._0_4_;
            auVar34._4_4_ = local_2528._4_4_ + local_2538._4_4_;
            auVar34._8_4_ = local_2528._8_4_ + local_2538._8_4_;
            auVar34._12_4_ = local_2528._12_4_ + local_2538._12_4_;
            uVar8 = vcmpps_avx512vl(auVar34,local_2508,2);
            local_24f7 = (byte)uVar9 & (byte)uVar6 & (byte)uVar7 & (byte)uVar8;
            if (local_24f7 != 0) {
              auVar53._0_4_ = local_2498._0_4_ * auVar29._0_4_;
              auVar53._4_4_ = local_2498._4_4_ * auVar29._4_4_;
              auVar53._8_4_ = local_2498._8_4_ * auVar29._8_4_;
              auVar53._12_4_ = local_2498._12_4_ * auVar29._12_4_;
              auVar26 = vfmadd213ps_fma(auVar28,local_24a8,auVar53);
              auVar26 = vfmadd213ps_fma(auVar27,local_24b8,auVar26);
              local_2518._0_4_ = (float)(uVar56 ^ auVar26._0_4_);
              local_2518._4_4_ = (float)(uVar57 ^ auVar26._4_4_);
              local_2518._8_4_ = (float)(uVar58 ^ auVar26._8_4_);
              local_2518._12_4_ = (float)(uVar59 ^ auVar26._12_4_);
              uVar48 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar11._4_4_ = uVar48;
              auVar11._0_4_ = uVar48;
              auVar11._8_4_ = uVar48;
              auVar11._12_4_ = uVar48;
              auVar26 = vmulps_avx512vl(local_2508,auVar11);
              fVar44 = (ray->super_RayK<1>).tfar;
              auVar12._4_4_ = fVar44;
              auVar12._0_4_ = fVar44;
              auVar12._8_4_ = fVar44;
              auVar12._12_4_ = fVar44;
              auVar34 = vmulps_avx512vl(local_2508,auVar12);
              uVar9 = vcmpps_avx512vl(local_2518,auVar34,2);
              uVar6 = vcmpps_avx512vl(auVar26,local_2518,1);
              local_24f7 = (byte)uVar9 & (byte)uVar6 & local_24f7;
              if (local_24f7 != 0) {
                lVar21 = lVar21 + uVar22;
                auVar26 = vrcp14ps_avx512vl(local_2508);
                auVar13._8_4_ = 0x3f800000;
                auVar13._0_8_ = &DAT_3f8000003f800000;
                auVar13._12_4_ = 0x3f800000;
                auVar34 = vfnmadd213ps_avx512vl(local_2508,auVar26,auVar13);
                auVar26 = vfmadd132ps_fma(auVar34,auVar26,auVar26);
                fVar44 = auVar26._0_4_;
                local_24c8._0_4_ = fVar44 * local_2518._0_4_;
                fVar49 = auVar26._4_4_;
                local_24c8._4_4_ = fVar49 * local_2518._4_4_;
                fVar50 = auVar26._8_4_;
                local_24c8._8_4_ = fVar50 * local_2518._8_4_;
                fVar51 = auVar26._12_4_;
                local_24c8._12_4_ = fVar51 * local_2518._12_4_;
                auVar47 = ZEXT1664(local_24c8);
                local_24e8[0] = fVar44 * local_2538._0_4_;
                local_24e8[1] = fVar49 * local_2538._4_4_;
                local_24e8[2] = fVar50 * local_2538._8_4_;
                local_24e8[3] = fVar51 * local_2538._12_4_;
                local_24d8[0] = fVar44 * local_2528._0_4_;
                local_24d8[1] = fVar49 * local_2528._4_4_;
                local_24d8[2] = fVar50 * local_2528._8_4_;
                local_24d8[3] = fVar51 * local_2528._12_4_;
                local_25a8 = context->scene;
                auVar45._8_4_ = 0x7f800000;
                auVar45._0_8_ = 0x7f8000007f800000;
                auVar45._12_4_ = 0x7f800000;
                auVar26 = vblendmps_avx512vl(auVar45,local_24c8);
                auVar35._0_4_ =
                     (uint)(local_24f7 & 1) * auVar26._0_4_ |
                     (uint)!(bool)(local_24f7 & 1) * 0x7f800000;
                bVar4 = (bool)(local_24f7 >> 1 & 1);
                auVar35._4_4_ = (uint)bVar4 * auVar26._4_4_ | (uint)!bVar4 * 0x7f800000;
                bVar4 = (bool)(local_24f7 >> 2 & 1);
                auVar35._8_4_ = (uint)bVar4 * auVar26._8_4_ | (uint)!bVar4 * 0x7f800000;
                bVar4 = (bool)(local_24f7 >> 3 & 1);
                auVar35._12_4_ = (uint)bVar4 * auVar26._12_4_ | (uint)!bVar4 * 0x7f800000;
                auVar26 = vshufps_avx(auVar35,auVar35,0xb1);
                auVar26 = vminps_avx(auVar26,auVar35);
                auVar34 = vshufpd_avx(auVar26,auVar26,1);
                auVar26 = vminps_avx(auVar34,auVar26);
                uVar9 = vcmpps_avx512vl(auVar35,auVar26,0);
                local_260c = (uint)local_24f7;
                uVar56 = (uint)((byte)uVar9 & local_24f7);
                if (((byte)uVar9 & local_24f7) == 0) {
                  uVar56 = local_260c;
                }
                uVar18 = 0;
                for (uVar17 = (ulong)uVar56; (uVar17 & 1) == 0;
                    uVar17 = uVar17 >> 1 | 0x8000000000000000) {
                  uVar18 = uVar18 + 1;
                }
                do {
                  local_2550 = *(uint *)(lVar21 + 0x90 + uVar18 * 4);
                  local_25e8 = (ulong)local_2550;
                  local_25e0 = (local_25a8->geometries).items[local_2550].ptr;
                  if ((local_25e0->mask & (ray->super_RayK<1>).mask) == 0) {
                    local_260c = (uint)(~(byte)(1 << ((uint)uVar18 & 0x1f)) & (byte)local_260c);
                    bVar4 = true;
                  }
                  else {
                    local_25f0 = context->args;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (local_25e0->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      bVar4 = false;
                    }
                    else {
                      local_2488 = auVar47._0_16_;
                      local_2478 = auVar70._0_32_;
                      local_2458 = auVar69._0_32_;
                      local_2438 = auVar68._0_32_;
                      local_2418 = auVar67._0_32_;
                      local_23f8 = auVar65._0_32_;
                      local_23d8 = auVar64._0_32_;
                      local_23b8 = auVar63._0_32_;
                      local_2598.context = context->user;
                      local_2568 = *(float *)(local_24b8 + uVar18 * 4);
                      local_2564 = *(undefined4 *)(local_24a8 + uVar18 * 4);
                      local_2560 = *(undefined4 *)(local_2498 + uVar18 * 4);
                      local_255c = local_24e8[uVar18];
                      local_2558 = local_24d8[uVar18];
                      local_2554 = *(undefined4 *)(lVar21 + 0xa0 + uVar18 * 4);
                      local_254c = (local_2598.context)->instID[0];
                      local_2548 = (local_2598.context)->instPrimID[0];
                      fVar44 = (ray->super_RayK<1>).tfar;
                      (ray->super_RayK<1>).tfar = *(float *)(local_24c8 + uVar18 * 4);
                      local_25f4 = -1;
                      local_2598.valid = &local_25f4;
                      local_2598.geometryUserPtr = local_25e0->userPtr;
                      local_2598.ray = (RTCRayN *)ray;
                      local_2598.hit = (RTCHitN *)&local_2568;
                      local_2598.N = 1;
                      if ((local_25e0->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                         ((*local_25e0->intersectionFilterN)(&local_2598), *local_2598.valid != 0))
                      {
                        if (local_25f0->filter != (RTCFilterFunctionN)0x0) {
                          if (((local_25f0->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((local_25e0->field_8).field_0x2 & 0x40) != 0)) {
                            (*local_25f0->filter)(&local_2598);
                          }
                          if (*local_2598.valid == 0) goto LAB_01fb9eba;
                        }
                        (((Vec3f *)((long)local_2598.ray + 0x30))->field_0).field_0.x =
                             *(float *)local_2598.hit;
                        (((Vec3f *)((long)local_2598.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_2598.hit + 4);
                        (((Vec3f *)((long)local_2598.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_2598.hit + 8);
                        *(float *)((long)local_2598.ray + 0x3c) = *(float *)(local_2598.hit + 0xc);
                        *(float *)((long)local_2598.ray + 0x40) = *(float *)(local_2598.hit + 0x10);
                        *(float *)((long)local_2598.ray + 0x44) = *(float *)(local_2598.hit + 0x14);
                        *(float *)((long)local_2598.ray + 0x48) = *(float *)(local_2598.hit + 0x18);
                        *(float *)((long)local_2598.ray + 0x4c) = *(float *)(local_2598.hit + 0x1c);
                        *(float *)((long)local_2598.ray + 0x50) = *(float *)(local_2598.hit + 0x20);
                      }
                      else {
LAB_01fb9eba:
                        (ray->super_RayK<1>).tfar = fVar44;
                      }
                      auVar47 = ZEXT1664(local_2488);
                      fVar44 = (ray->super_RayK<1>).tfar;
                      auVar14._4_4_ = fVar44;
                      auVar14._0_4_ = fVar44;
                      auVar14._8_4_ = fVar44;
                      auVar14._12_4_ = fVar44;
                      uVar9 = vcmpps_avx512vl(local_2488,auVar14,2);
                      local_260c = (uint)(byte)(~(byte)(1 << ((uint)uVar18 & 0x1f)) &
                                                (byte)local_260c & (byte)uVar9);
                      bVar4 = true;
                      auVar63 = ZEXT3264(local_23b8);
                      auVar64 = ZEXT3264(local_23d8);
                      auVar65 = ZEXT3264(local_23f8);
                      auVar37 = vbroadcastss_avx512vl(ZEXT416(1));
                      auVar66 = ZEXT3264(auVar37);
                      auVar67 = ZEXT3264(local_2418);
                      auVar68 = ZEXT3264(local_2438);
                      auVar69 = ZEXT3264(local_2458);
                      auVar70 = ZEXT3264(local_2478);
                      auVar37 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
                      auVar71 = ZEXT3264(auVar37);
                      auVar37 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
                      auVar72 = ZEXT3264(auVar37);
                      auVar26 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
                      auVar73 = ZEXT1664(auVar26);
                      auVar37 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                      auVar74 = ZEXT3264(auVar37);
                      auVar37 = vpmovsxbd_avx512vl(ZEXT816(0x5040302010008));
                      auVar75 = ZEXT3264(auVar37);
                    }
                  }
                  if (!bVar4) {
                    fVar44 = local_24e8[uVar18];
                    fVar49 = local_24d8[uVar18];
                    (ray->super_RayK<1>).tfar = *(float *)(local_24c8 + uVar18 * 4);
                    (ray->Ng).field_0.field_0.x = *(float *)(local_24b8 + uVar18 * 4);
                    (ray->Ng).field_0.field_0.y = *(float *)(local_24a8 + uVar18 * 4);
                    (ray->Ng).field_0.field_0.z = *(float *)(local_2498 + uVar18 * 4);
                    ray->u = fVar44;
                    ray->v = fVar49;
                    ray->primID = *(uint *)(lVar21 + 0xa0 + uVar18 * 4);
                    ray->geomID = (uint)local_25e8;
                    pRVar3 = context->user;
                    ray->instID[0] = pRVar3->instID[0];
                    ray->instPrimID[0] = pRVar3->instPrimID[0];
                    break;
                  }
                  bVar15 = (byte)local_260c;
                  if (bVar15 == 0) break;
                  auVar46._8_4_ = 0x7f800000;
                  auVar46._0_8_ = 0x7f8000007f800000;
                  auVar46._12_4_ = 0x7f800000;
                  auVar26 = vblendmps_avx512vl(auVar46,auVar47._0_16_);
                  auVar36._0_4_ =
                       (uint)(bVar15 & 1) * auVar26._0_4_ | (uint)!(bool)(bVar15 & 1) * 0x7f800000;
                  bVar4 = (bool)((byte)(local_260c >> 1) & 1);
                  auVar36._4_4_ = (uint)bVar4 * auVar26._4_4_ | (uint)!bVar4 * 0x7f800000;
                  bVar4 = (bool)((byte)(local_260c >> 2) & 1);
                  auVar36._8_4_ = (uint)bVar4 * auVar26._8_4_ | (uint)!bVar4 * 0x7f800000;
                  bVar4 = (bool)((byte)(local_260c >> 3) & 1);
                  auVar36._12_4_ = (uint)bVar4 * auVar26._12_4_ | (uint)!bVar4 * 0x7f800000;
                  auVar26 = vshufps_avx(auVar36,auVar36,0xb1);
                  auVar26 = vminps_avx(auVar26,auVar36);
                  auVar34 = vshufpd_avx(auVar26,auVar26,1);
                  auVar26 = vminps_avx(auVar34,auVar26);
                  uVar9 = vcmpps_avx512vl(auVar36,auVar26,0);
                  bVar15 = (byte)uVar9 & bVar15;
                  uVar56 = local_260c;
                  if (bVar15 != 0) {
                    uVar56 = (uint)bVar15;
                  }
                  uVar57 = 0;
                  for (; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x80000000) {
                    uVar57 = uVar57 + 1;
                  }
                  uVar18 = (ulong)uVar57;
                } while( true );
              }
            }
            lVar19 = lVar19 + 1;
          } while (lVar19 != uVar20 - 8);
        }
        fVar44 = (ray->super_RayK<1>).tfar;
        auVar47 = ZEXT3264(CONCAT428(fVar44,CONCAT424(fVar44,CONCAT420(fVar44,CONCAT416(fVar44,
                                                  CONCAT412(fVar44,CONCAT48(fVar44,CONCAT44(fVar44,
                                                  fVar44))))))));
        auVar55 = ZEXT3264(local_2398);
        uVar20 = local_25a0;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }